

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::iterate
          (BinaryAtomicOperationCase *this)

{
  TextureType TVar1;
  AtomicOperation AVar2;
  Vector<int,_3> *pVVar3;
  GLenum GVar4;
  undefined8 log_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int d;
  deUint32 dVar9;
  deUint32 textureBufGL;
  GLSLVersion version;
  GLuint num_groups_y;
  Functional *this_00;
  Functions *pFVar10;
  MessageBuilder *pMVar11;
  long lVar12;
  char *pcVar13;
  ProgramSources *sources;
  ImageLayerVerifier *verifyLayer;
  string *y_00;
  TextureFormat *format;
  RenderContext *renderContext;
  ReturnValueVerifier *local_1628;
  ReturnValueVerifier *local_1610;
  deUint32 local_15f4;
  deUint32 local_15f0;
  deUint32 local_15ec;
  deUint32 local_15e8;
  char *local_1530;
  char *local_1518;
  char *local_14f0;
  GLuint local_13f4;
  DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>
  local_13dd;
  Vector<int,_3> local_13dc;
  ReturnValueVerifier *local_13d0;
  undefined1 local_13c1;
  ReturnValueVerifier *local_13c0;
  undefined1 local_13b8 [8];
  UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
  verifier;
  undefined1 local_1398 [8];
  IVec3 textureToCheckSize;
  deUint32 textureToCheckBufGL;
  deUint32 textureToCheckGL;
  UniformAccessLogger uniforms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330;
  byte local_130d;
  byte local_130c;
  byte local_130b;
  byte local_130a;
  byte local_1309;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  byte local_1245;
  allocator<char> local_1244;
  byte local_1243;
  byte local_1242;
  byte local_1241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11e0;
  string local_11c0;
  string local_11a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1000;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fe0;
  ShaderSource local_fc0;
  ProgramSources local_f98;
  undefined1 local_ec8 [8];
  ShaderProgram program;
  undefined1 local_df0 [8];
  string glslVersionDeclaration;
  string shaderImageTypeStr;
  string shaderImageFormatStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cf0;
  undefined1 local_cd0 [8];
  string atomicInvocation;
  allocator<char> local_ca1;
  string local_ca0;
  allocator<char> local_c79;
  string local_c78;
  allocator<char> local_c51;
  string local_c50;
  string local_c30;
  undefined1 local_c10 [8];
  string atomicArgExpr;
  undefined1 local_be8 [8];
  string invocationCoord;
  string local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  byte local_b7e;
  byte local_b7d;
  int local_b7c;
  string local_b78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  byte local_b35;
  int local_b34;
  string local_b30;
  undefined1 local_b10 [8];
  string atomicCoord;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae8;
  undefined1 local_ac8 [8];
  string colorVecTypeName;
  IVec3 local_a9c;
  MessageBuilder local_a90;
  int local_90c;
  MessageBuilder local_908;
  int local_784;
  int local_780;
  int x;
  int y;
  int z;
  IVec4 initial;
  LayeredImage imageData;
  MessageBuilder local_6f8;
  deUint32 local_574;
  MessageBuilder local_570;
  deUint32 local_3ec;
  MessageBuilder local_3e8;
  deUint32 local_264;
  MessageBuilder local_260;
  undefined1 local_e0 [8];
  Texture returnValueTexture;
  Texture endResultTexture;
  Buffer returnValueTextureBuf;
  Buffer endResultTextureBuf;
  undefined1 local_74 [2];
  bool isIntFormat;
  bool isUintFormat;
  int numSlicesOrFaces;
  Vector<int,_3> *local_68;
  IVec3 *imageSize;
  deUint32 textureTargetGL;
  TextureFormat local_50;
  deUint32 local_44;
  undefined1 local_40 [4];
  deUint32 internalFormatGL;
  CallLogWrapper glLog;
  TestLog *log;
  RenderContext *renderCtx;
  BinaryAtomicOperationCase *this_local;
  
  this_00 = (Functional *)gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glLog._16_8_ = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pFVar10 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))();
  glu::CallLogWrapper::CallLogWrapper((CallLogWrapper *)local_40,pFVar10,(TestLog *)glLog._16_8_);
  local_50 = this->m_format;
  local_44 = glu::getInternalFormat(local_50);
  imageSize._0_4_ = Functional::getGLTextureTarget(this->m_imageType);
  defaultImageSize((Functional *)local_74,this->m_imageType);
  local_68 = (Vector<int,_3> *)local_74;
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    local_13f4 = 6;
  }
  else {
    local_13f4 = tcu::Vector<int,_3>::z(local_68);
  }
  bVar5 = isFormatTypeUnsignedInteger((this->m_format).type);
  bVar6 = isFormatTypeSignedInteger((this->m_format).type);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &returnValueTextureBuf.super_ObjectWrapper.m_object,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &endResultTexture.super_ObjectWrapper.m_object,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)
             &returnValueTexture.super_ObjectWrapper.m_object,(RenderContext *)this_00);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_e0,(RenderContext *)this_00);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_40,true);
  tcu::TestLog::operator<<
            (&local_260,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<(&local_260,(char (*) [28])"// Created a texture (name ")
  ;
  local_264 = glu::ObjectWrapper::operator*
                        ((ObjectWrapper *)&returnValueTexture.super_ObjectWrapper.m_object);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_264);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (pMVar11,(char (*) [44])") to act as the target of atomic operations");
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_260);
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    tcu::TestLog::operator<<
              (&local_3e8,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_3e8,(char (*) [43])"// Created a buffer for the texture (name ");
    local_3ec = glu::ObjectWrapper::operator*
                          ((ObjectWrapper *)&returnValueTextureBuf.super_ObjectWrapper.m_object);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_3ec);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a94734);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3e8);
  }
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    tcu::TestLog::operator<<
              (&local_570,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_570,(char (*) [28])"// Created a texture (name ");
    local_574 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e0);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_574);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,(char (*) [77])
                                 ") to which the intermediate return values of the atomic operation are stored"
                        );
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_570);
    if (this->m_imageType == TEXTURETYPE_BUFFER) {
      tcu::TestLog::operator<<
                (&local_6f8,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (&local_6f8,(char (*) [43])"// Created a buffer for the texture (name ");
      imageData.m_tex2DArray.m_state._4_4_ =
           glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&endResultTexture.super_ObjectWrapper.m_object);
      pMVar11 = tcu::MessageBuilder::operator<<
                          (pMVar11,(uint *)((long)&imageData.m_tex2DArray.m_state + 4));
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a94734);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_6f8);
    }
  }
  TVar1 = this->m_imageType;
  iVar7 = tcu::Vector<int,_3>::x(local_68);
  iVar8 = tcu::Vector<int,_3>::y(local_68);
  d = tcu::Vector<int,_3>::z(local_68);
  LayeredImage::LayeredImage
            ((LayeredImage *)(initial.m_data + 2),TVar1,&this->m_format,iVar7,iVar8,d);
  iVar7 = getOperationInitialValue(this->m_operation);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&y,iVar7);
  for (x = 0; x < (int)local_13f4; x = x + 1) {
    for (local_780 = 0; iVar7 = local_780, iVar8 = tcu::Vector<int,_3>::y(local_68), iVar7 < iVar8;
        local_780 = local_780 + 1) {
      for (local_784 = 0; iVar7 = local_784, iVar8 = tcu::Vector<int,_3>::x(local_68), iVar7 < iVar8
          ; local_784 = local_784 + 1) {
        Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                  ((LayeredImage *)(initial.m_data + 2),local_784,local_780,x,(Vector<int,_4> *)&y);
      }
    }
  }
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c0);
  GVar4 = (deUint32)imageSize;
  dVar9 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)&returnValueTexture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,GVar4,dVar9);
  setTexParameteri((CallLogWrapper *)local_40,(deUint32)imageSize);
  tcu::TestLog::operator<<
            (&local_908,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      (&local_908,
                       (char (*) [67])
                       "// Filling end-result texture with initial pattern (initial value ");
  local_90c = getOperationInitialValue(this->m_operation);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_90c);
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a94734);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_908);
  dVar9 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)&returnValueTextureBuf.super_ObjectWrapper.m_object);
  uploadTexture((CallLogWrapper *)local_40,(LayeredImage *)(initial.m_data + 2),dVar9);
  LayeredImage::~LayeredImage((LayeredImage *)(initial.m_data + 2));
  dVar9 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)&returnValueTexture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)local_40,0,dVar9,0,'\x01',0,0x88ba,local_44);
  lVar12 = (**(code **)(*(long *)this_00 + 0x18))();
  dVar9 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar9,"glBindImageTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                  ,0x7c0);
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c1);
    GVar4 = (deUint32)imageSize;
    dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e0);
    glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,GVar4,dVar9);
    setTexParameteri((CallLogWrapper *)local_40,(deUint32)imageSize);
    tcu::TestLog::operator<<
              (&local_a90,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_a90,(char (*) [43])"// Setting storage of return-value texture");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_a90);
    dVar9 = local_44;
    pVVar3 = local_68;
    TVar1 = this->m_imageType;
    if (this->m_imageType == TEXTURETYPE_CUBE) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&colorVecTypeName.field_2 + 8),5,5,1);
    }
    else {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)&colorVecTypeName.field_2 + 8),5,1,1);
    }
    tcu::operator*((tcu *)&local_a9c,pVVar3,(Vector<int,_3> *)((long)&colorVecTypeName.field_2 + 8))
    ;
    textureBufGL = glu::ObjectWrapper::operator*
                             ((ObjectWrapper *)&endResultTexture.super_ObjectWrapper.m_object);
    setTextureStorage((CallLogWrapper *)local_40,TVar1,dVar9,&local_a9c,textureBufGL);
    dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e0);
    glu::CallLogWrapper::glBindImageTexture
              ((CallLogWrapper *)local_40,1,dVar9,0,'\x01',0,0x88b9,local_44);
    lVar12 = (**(code **)(*(long *)this_00 + 0x18))();
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"glBindImageTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,2000);
  }
  if (bVar5) {
    local_14f0 = "u";
  }
  else {
    local_14f0 = "";
    if (bVar6) {
      local_14f0 = "i";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae8,local_14f0,
             (allocator<char> *)(atomicCoord.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8,
                 &local_ae8,"vec4");
  std::__cxx11::string::~string((string *)&local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)(atomicCoord.field_2._M_local_buf + 0xf));
  local_b35 = 0;
  local_b7d = 0;
  local_b7e = 0;
  invocationCoord.field_2._M_local_buf[0xb] = '\0';
  invocationCoord.field_2._M_local_buf[10] = '\0';
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    local_b34 = tcu::Vector<int,_3>::x(local_68);
    de::toString<int>(&local_b30,&local_b34);
    local_b35 = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b10,
                   "gx % ",&local_b30);
  }
  else if (this->m_imageType == TEXTURETYPE_2D) {
    local_b7c = tcu::Vector<int,_3>::x(local_68);
    de::toString<int>(&local_b78,&local_b7c);
    local_b7d = 1;
    std::operator+(&local_b58,"ivec2(gx % ",&local_b78);
    local_b7e = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b10,
                   &local_b58,", gy)");
  }
  else {
    invocationCoord.field_2._12_4_ = tcu::Vector<int,_3>::x(local_68);
    de::toString<int>(&local_bc0,(int *)(invocationCoord.field_2._M_local_buf + 0xc));
    invocationCoord.field_2._M_local_buf[0xb] = '\x01';
    std::operator+(&local_ba0,"ivec3(gx % ",&local_bc0);
    invocationCoord.field_2._M_local_buf[10] = '\x01';
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b10,
                   &local_ba0,", gy, gz)");
  }
  if ((invocationCoord.field_2._M_local_buf[10] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_ba0);
  }
  if ((invocationCoord.field_2._M_local_buf[0xb] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_bc0);
  }
  if ((local_b7e & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b58);
  }
  if ((local_b7d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b78);
  }
  if ((local_b35 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b30);
  }
  if (this->m_imageType == TEXTURETYPE_BUFFER) {
    local_1518 = "gx";
  }
  else {
    local_1518 = "ivec3(gx, gy, gz)";
    if (this->m_imageType == TEXTURETYPE_2D) {
      local_1518 = "ivec2(gx, gy)";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_be8,local_1518,
             (allocator<char> *)(atomicArgExpr.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(atomicArgExpr.field_2._M_local_buf + 0xf));
  if (bVar5) {
    local_1530 = "uint";
  }
  else {
    local_1530 = "float";
    if (bVar6) {
      local_1530 = "";
    }
  }
  AVar2 = this->m_operation;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c50,"gx",&local_c51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c78,"gy",&local_c79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca0,"gz",&local_ca1);
  iVar7 = tcu::Vector<int,_3>::x(local_68);
  iVar8 = tcu::Vector<int,_3>::y(local_68);
  tcu::Vector<int,_2>::Vector
            ((Vector<int,_2> *)((long)&atomicInvocation.field_2 + 0xc),iVar7 * 5,iVar8);
  y_00 = &local_c78;
  getAtomicFuncArgumentShaderStr
            (&local_c30,AVar2,&local_c50,y_00,&local_ca0,
             (IVec2 *)((long)&atomicInvocation.field_2 + 0xc));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c10,
                 local_1530,&local_c30);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::allocator<char>::~allocator(&local_ca1);
  std::__cxx11::string::~string((string *)&local_c78);
  std::allocator<char>::~allocator(&local_c79);
  std::__cxx11::string::~string((string *)&local_c50);
  std::allocator<char>::~allocator(&local_c51);
  std::__cxx11::string::string((string *)(shaderImageFormatStr.field_2._M_local_buf + 8));
  pcVar13 = getAtomicOperationShaderFuncName(this->m_operation);
  std::operator+(&local_d70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&shaderImageFormatStr.field_2 + 8),pcVar13);
  std::operator+(&local_d50,&local_d70,"(u_results, ");
  std::operator+(&local_d30,&local_d50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b10);
  std::operator+(&local_d10,&local_d30,", ");
  std::operator+(&local_cf0,&local_d10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cd0,
                 &local_cf0,")");
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string((string *)&local_d10);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_d50);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string((string *)(shaderImageFormatStr.field_2._M_local_buf + 8));
  getShaderImageFormatQualifier_abi_cxx11_
            ((string *)((long)&shaderImageTypeStr.field_2 + 8),(Functional *)&this->m_format,format)
  ;
  getShaderImageType_abi_cxx11_
            ((string *)((long)&glslVersionDeclaration.field_2 + 8),
             (Functional *)(ulong)(this->m_format).type,this->m_imageType,(TextureType)y_00);
  program.m_program.m_info.linkTimeUs._4_4_ = (**(code **)(*(long *)this_00 + 0x10))();
  version = glu::getContextTypeGLSLVersion((ContextType)program.m_program.m_info.linkTimeUs._4_4_);
  pcVar13 = glu::getGLSLVersionDeclaration(version);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_df0,pcVar13,
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  glu::ProgramSources::ProgramSources(&local_f98);
  std::operator+(&local_1180,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_df0,"\n"
                );
  imageAtomicExtensionShaderRequires_abi_cxx11_(&local_11a0,this_00,renderContext);
  std::operator+(&local_1160,&local_1180,&local_11a0);
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_11c0,(Functional *)(ulong)this->m_imageType,(TextureType)this_00,
             (RenderContext *)y_00);
  std::operator+(&local_1140,&local_1160,&local_11c0);
  std::operator+(&local_1120,&local_1140,"\nprecision highp ");
  std::operator+(&local_1100,&local_1120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_10e0,&local_1100,
                 ";\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (")
  ;
  std::operator+(&local_10c0,&local_10e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&shaderImageTypeStr.field_2 + 8));
  std::operator+(&local_10a0,&local_10c0,", binding=0) coherent uniform ");
  std::operator+(&local_1080,&local_10a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&glslVersionDeclaration.field_2 + 8));
  std::operator+(&local_1060,&local_1080," u_results;\n");
  local_1241 = 0;
  local_1242 = 0;
  local_1243 = 0;
  local_1245 = 0;
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_1240,"layout (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&shaderImageTypeStr.field_2 + 8));
    local_1241 = 1;
    std::operator+(&local_1220,&local_1240,", binding=1) writeonly uniform ");
    local_1242 = 1;
    std::operator+(&local_1200,&local_1220,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&glslVersionDeclaration.field_2 + 8));
    local_1243 = 1;
    std::operator+(&local_11e0,&local_1200," u_returnValues;\n");
  }
  else {
    std::allocator<char>::allocator();
    local_1245 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11e0,"",&local_1244);
  }
  std::operator+(&local_1040,&local_1060,&local_11e0);
  std::operator+(&local_1020,&local_1040,
                 "\nvoid main (void)\n{\n\tint gx = int(gl_GlobalInvocationID.x);\n\tint gy = int(gl_GlobalInvocationID.y);\n\tint gz = int(gl_GlobalInvocationID.z);\n"
                );
  local_1309 = 0;
  local_130a = 0;
  local_130b = 0;
  local_130c = 0;
  local_130d = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
    std::operator+(&local_1308,"\timageStore(u_returnValues, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_be8);
    local_1309 = 1;
    std::operator+(&local_12e8,&local_1308,", ");
    local_130a = 1;
    std::operator+(&local_12c8,&local_12e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ac8);
    local_130b = 1;
    std::operator+(&local_12a8,&local_12c8,"(");
    local_130c = 1;
    std::operator+(&local_1288,&local_12a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cd0);
    local_130d = 1;
    std::operator+(&local_1268,&local_1288,"));\n");
  }
  else if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
    std::operator+(&local_1330,"\t",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_cd0);
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
    std::operator+(&local_1268,&local_1330,";\n");
  }
  else {
    std::allocator<char>::allocator();
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1268,(char *)0x0,
               (allocator<char> *)
               ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
               + 6));
  }
  std::operator+(&local_1000,&local_1020,&local_1268);
  std::operator+(&local_fe0,&local_1000,"}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_fc0,&local_fe0);
  sources = glu::ProgramSources::operator<<(&local_f98,&local_fc0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_ec8,(RenderContext *)this_00,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_fc0);
  std::__cxx11::string::~string((string *)&local_fe0);
  std::__cxx11::string::~string((string *)&local_1000);
  std::__cxx11::string::~string((string *)&local_1268);
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0)
  {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
               + 6));
  }
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0)
  {
    std::__cxx11::string::~string((string *)&local_1330);
  }
  if ((local_130d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1288);
  }
  if ((local_130c & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_12a8);
  }
  if ((local_130b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_12c8);
  }
  if ((local_130a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_12e8);
  }
  if ((local_1309 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1308);
  }
  std::__cxx11::string::~string((string *)&local_1020);
  std::__cxx11::string::~string((string *)&local_1040);
  std::__cxx11::string::~string((string *)&local_11e0);
  if ((local_1245 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1244);
  }
  if ((local_1243 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1200);
  }
  if ((local_1242 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1220);
  }
  if ((local_1241 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1240);
  }
  std::__cxx11::string::~string((string *)&local_1060);
  std::__cxx11::string::~string((string *)&local_1080);
  std::__cxx11::string::~string((string *)&local_10a0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::__cxx11::string::~string((string *)&local_10e0);
  std::__cxx11::string::~string((string *)&local_1100);
  std::__cxx11::string::~string((string *)&local_1120);
  std::__cxx11::string::~string((string *)&local_1140);
  std::__cxx11::string::~string((string *)&local_11c0);
  std::__cxx11::string::~string((string *)&local_1160);
  std::__cxx11::string::~string((string *)&local_11a0);
  std::__cxx11::string::~string((string *)&local_1180);
  glu::ProgramSources::~ProgramSources(&local_f98);
  pFVar10 = (Functions *)(**(code **)(*(long *)this_00 + 0x18))();
  log_00 = glLog._16_8_;
  dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_ec8);
  UniformAccessLogger::UniformAccessLogger
            ((UniformAccessLogger *)&textureToCheckGL,pFVar10,(TestLog *)log_00,dVar9);
  glu::operator<<((TestLog *)glLog._16_8_,(ShaderProgram *)local_ec8);
  bVar5 = glu::ShaderProgram::isOk((ShaderProgram *)local_ec8);
  if (bVar5) {
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_ec8);
    glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_40,dVar9);
    iVar7 = tcu::Vector<int,_3>::x(local_68);
    num_groups_y = tcu::Vector<int,_3>::y(local_68);
    glu::CallLogWrapper::glDispatchCompute
              ((CallLogWrapper *)local_40,iVar7 * 5,num_groups_y,local_13f4);
    lVar12 = (**(code **)(*(long *)this_00 + 0x18))();
    dVar9 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar9,"glDispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                    ,0x810);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
    this_local._4_4_ = STOP;
  }
  UniformAccessLogger::~UniformAccessLogger((UniformAccessLogger *)&textureToCheckGL);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_ec8);
  std::__cxx11::string::~string((string *)local_df0);
  std::__cxx11::string::~string((string *)(glslVersionDeclaration.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(shaderImageTypeStr.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_cd0);
  std::__cxx11::string::~string((string *)local_c10);
  std::__cxx11::string::~string((string *)local_be8);
  std::__cxx11::string::~string((string *)local_b10);
  std::__cxx11::string::~string((string *)local_ac8);
  if (bVar5) {
    if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      local_15e8 = glu::ObjectWrapper::operator*
                             ((ObjectWrapper *)&returnValueTexture.super_ObjectWrapper.m_object);
    }
    else {
      if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
        local_15ec = glu::ObjectWrapper::operator*((ObjectWrapper *)local_e0);
      }
      else {
        local_15ec = 0xffffffff;
      }
      local_15e8 = local_15ec;
    }
    textureToCheckSize.m_data[2] = local_15e8;
    if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      local_15f0 = glu::ObjectWrapper::operator*
                             ((ObjectWrapper *)&returnValueTextureBuf.super_ObjectWrapper.m_object);
    }
    else {
      if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
        local_15f4 = glu::ObjectWrapper::operator*
                               ((ObjectWrapper *)&endResultTexture.super_ObjectWrapper.m_object);
      }
      else {
        local_15f4 = 0xffffffff;
      }
      local_15f0 = local_15f4;
    }
    pVVar3 = local_68;
    textureToCheckSize.m_data[1] = local_15f0;
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)
               &verifier.
                super_UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                .m_data.field_0xc,
               (uint)(this->m_caseType != ATOMIC_OPERATION_CASE_TYPE_END_RESULT) * 4 + 1,1,1);
    tcu::operator*((tcu *)local_1398,pVVar3,
                   (Vector<int,_3> *)
                   &verifier.
                    super_UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                    .m_data.field_0xc);
    local_13c1 = 0;
    local_13dc.m_data[2]._3_1_ = 0;
    if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT) {
      local_1610 = (ReturnValueVerifier *)operator_new(0x10);
      local_13c1 = 1;
      local_13c0 = local_1610;
      EndResultVerifier::EndResultVerifier
                ((EndResultVerifier *)local_1610,this->m_operation,this->m_imageType);
    }
    else {
      if (this->m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES) {
        local_1628 = (ReturnValueVerifier *)operator_new(0x18);
        local_13dc.m_data[2]._3_1_ = 1;
        TVar1 = this->m_imageType;
        AVar2 = this->m_operation;
        local_13d0 = local_1628;
        tcu::Vector<int,_3>::swizzle(&local_13dc,(int)local_68,0);
        ReturnValueVerifier::ReturnValueVerifier(local_1628,AVar2,TVar1,(IVec2 *)&local_13dc);
      }
      else {
        local_1628 = (ReturnValueVerifier *)0x0;
      }
      local_1610 = local_1628;
    }
    de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>::
    DefaultDeleter(&local_13dd);
    de::details::
    UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
    ::UniquePtr((UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                 *)local_13b8,local_1610);
    iVar8 = textureToCheckSize.m_data[2];
    iVar7 = textureToCheckSize.m_data[1];
    TVar1 = this->m_imageType;
    verifyLayer = de::details::
                  UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                  ::operator*((UniqueBase<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                               *)local_13b8);
    bVar5 = readTextureAndVerify
                      ((RenderContext *)this_00,(CallLogWrapper *)local_40,iVar8,iVar7,TVar1,
                       &this->m_format,(IVec3 *)local_1398,verifyLayer);
    if (bVar5) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image verification failed");
    }
    this_local._4_4_ = STOP;
    de::details::
    UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
    ::~UniquePtr((UniquePtr<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier,_de::DefaultDeleter<const_deqp::gles31::Functional::(anonymous_namespace)::ImageLayerVerifier>_>
                  *)local_13b8);
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_e0);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)
             &returnValueTexture.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &endResultTexture.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)
             &returnValueTextureBuf.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_40);
  return this_local._4_4_;
}

Assistant:

BinaryAtomicOperationCase::IterateResult BinaryAtomicOperationCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_imageType);
	const IVec3&				imageSize				= defaultImageSize(m_imageType);
	const int					numSlicesOrFaces		= m_imageType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
	const bool					isIntFormat				= isFormatTypeSignedInteger(m_format.type);
	const glu::Buffer			endResultTextureBuf		(renderCtx);
	const glu::Buffer			returnValueTextureBuf	(renderCtx);
	const glu::Texture			endResultTexture		(renderCtx); //!< Texture for the final result; i.e. the texture on which the atomic operations are done. Size imageSize.
	const glu::Texture			returnValueTexture		(renderCtx); //!< Texture into which the return values are stored if m_caseType == CASETYPE_RETURN_VALUES.
																	 //	  Size imageSize*IVec3(N, 1, 1) or, for cube maps, imageSize*IVec3(N, N, 1) where N is NUM_INVOCATIONS_PER_PIXEL.

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created a texture (name " << *endResultTexture << ") to act as the target of atomic operations" << TestLog::EndMessage;
	if (m_imageType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *endResultTextureBuf << ")" << TestLog::EndMessage;

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		log << TestLog::Message << "// Created a texture (name " << *returnValueTexture << ") to which the intermediate return values of the atomic operation are stored" << TestLog::EndMessage;
		if (m_imageType == TEXTURETYPE_BUFFER)
			log << TestLog::Message << "// Created a buffer for the texture (name " << *returnValueTextureBuf << ")" << TestLog::EndMessage;
	}

	// Fill endResultTexture with initial pattern.

	{
		const LayeredImage imageData(m_imageType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		{
			const IVec4 initial(getOperationInitialValue(m_operation));

			for (int z = 0; z < numSlicesOrFaces; z++)
			for (int y = 0; y < imageSize.y(); y++)
			for (int x = 0; x < imageSize.x(); x++)
				imageData.setPixel(x, y, z, initial);
		}

		// Upload initial pattern to endResultTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE0);
		glLog.glBindTexture(textureTargetGL, *endResultTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Filling end-result texture with initial pattern (initial value " << getOperationInitialValue(m_operation) << ")" << TestLog::EndMessage;

		uploadTexture(glLog, imageData, *endResultTextureBuf);
	}

	glLog.glBindImageTexture(0, *endResultTexture, 0, GL_TRUE, 0, GL_READ_WRITE, internalFormatGL);
	GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

	if (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES)
	{
		// Set storage for returnValueTexture and bind to image.

		glLog.glActiveTexture(GL_TEXTURE1);
		glLog.glBindTexture(textureTargetGL, *returnValueTexture);
		setTexParameteri(glLog, textureTargetGL);

		log << TestLog::Message << "// Setting storage of return-value texture" << TestLog::EndMessage;
		setTextureStorage(glLog, m_imageType, internalFormatGL, imageSize * (m_imageType == TEXTURETYPE_CUBE ? IVec3(NUM_INVOCATIONS_PER_PIXEL, NUM_INVOCATIONS_PER_PIXEL,	1)
																											 : IVec3(NUM_INVOCATIONS_PER_PIXEL, 1,							1)),
						  *returnValueTextureBuf);

		glLog.glBindImageTexture(1, *returnValueTexture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");
	}

	// Perform image stores in compute shader and finalize reference computation.

	{
		// Generate compute shader.

		const string colorVecTypeName		= string(isUintFormat ? "u" : isIntFormat ? "i" : "") + "vec4";
		const string atomicCoord			= m_imageType == TEXTURETYPE_BUFFER		? "gx % " + toString(imageSize.x())
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx % " + toString(imageSize.x()) + ", gy)"
											: "ivec3(gx % " + toString(imageSize.x()) + ", gy, gz)";
		const string invocationCoord		= m_imageType == TEXTURETYPE_BUFFER		? "gx"
											: m_imageType == TEXTURETYPE_2D			? "ivec2(gx, gy)"
											: "ivec3(gx, gy, gz)";
		const string atomicArgExpr			= (isUintFormat		? "uint"
											 : isIntFormat		? ""
											 : "float")
												+ getAtomicFuncArgumentShaderStr(m_operation, "gx", "gy", "gz", IVec2(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y()));
		const string atomicInvocation		= string() + getAtomicOperationShaderFuncName(m_operation) + "(u_results, " + atomicCoord + ", " + atomicArgExpr + ")";
		const string shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const string shaderImageTypeStr		= getShaderImageType(m_format.type, m_imageType);
		const std::string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ imageAtomicExtensionShaderRequires(renderCtx)
														+ textureTypeExtensionShaderRequires(m_imageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) coherent uniform " + shaderImageTypeStr + " u_results;\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															  "layout (" + shaderImageFormatStr + ", binding=1) writeonly uniform " + shaderImageTypeStr + " u_returnValues;\n"
															: "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = int(gl_GlobalInvocationID.z);\n"
														+ (m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES ?
															"	imageStore(u_returnValues, " + invocationCoord + ", " + colorVecTypeName + "(" + atomicInvocation + "));\n"
														 : m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT ?
															"	" + atomicInvocation + ";\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		glLog.glDispatchCompute(NUM_INVOCATIONS_PER_PIXEL*imageSize.x(), imageSize.y(), numSlicesOrFaces);
		GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
	}

	// Read texture and check.

	{
		const deUint32								textureToCheckGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTexture
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTexture
																		: (deUint32)-1;
		const deUint32								textureToCheckBufGL	= m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? *endResultTextureBuf
																		: m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES	? *returnValueTextureBuf
																		: (deUint32)-1;

		const IVec3									textureToCheckSize	= imageSize * IVec3(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT ? 1 : NUM_INVOCATIONS_PER_PIXEL, 1, 1);
		const UniquePtr<const ImageLayerVerifier>	verifier			(m_caseType == ATOMIC_OPERATION_CASE_TYPE_END_RESULT		? new EndResultVerifier(m_operation, m_imageType)
																	   : m_caseType == ATOMIC_OPERATION_CASE_TYPE_RETURN_VALUES		? new ReturnValueVerifier(m_operation, m_imageType, imageSize.swizzle(0, 1))
																	   : (ImageLayerVerifier*)DE_NULL);

		if (readTextureAndVerify(renderCtx, glLog, textureToCheckGL, textureToCheckBufGL, m_imageType, m_format, textureToCheckSize, *verifier))
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

		return STOP;
	}
}